

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_math.hpp
# Opt level: O0

int32_t trng::int_math::modulo_helper<2147462579,_0>::modulo(uint64_t x)

{
  ulong uVar1;
  uint64_t x_local;
  
  uVar1 = (x & 0x7fffffff) + (x >> 0x1f) * 0x524d;
  x_local = (uVar1 & 0x7fffffff) + (uVar1 >> 0x1f) * 0x524d;
  if (0x7fffadb2 < x_local) {
    x_local = x_local - 0x7fffadb3;
  }
  return (int32_t)x_local;
}

Assistant:

TRNG_CUDA_ENABLE
      static int32_t modulo(uint64_t x) {
        if (mask == m) {
          uint32_t y{static_cast<uint32_t>((x & mask) + (x >> e))};
          if (y >= m)
            y -= m;
          return y;
        }
        if (static_cast<int64_t>(k) * (static_cast<int64_t>(k) + 2) <= m) {
          x = (x & mask) + (x >> e) * k;
          x = (x & mask) + (x >> e) * k;
          if (x >= m)
            x -= m;
          return static_cast<int32_t>(x);
        }
        return static_cast<int32_t>(x % m);
      }